

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void __thiscall
SpikesConsumer::SpikesConsumer
          (SpikesConsumer *this,HighFreqDataType *hf,int ringbufsize,HFParsingInfo *parseargs,int np
          )

{
  size_t sVar1;
  pointer piVar2;
  size_t in_RCX;
  undefined4 in_EDX;
  HFSubConsumer *in_RSI;
  HFParsingInfo *in_RDI;
  undefined4 in_R8D;
  HighFreqDataType *in_stack_ffffffffffffff10;
  HFParsingInfo *this_00;
  HighFreqDataType *in_stack_ffffffffffffff38;
  HighFreqDataType *in_stack_ffffffffffffff40;
  HFParsingInfo local_b8 [2];
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  this_00 = local_b8;
  HighFreqDataType::HighFreqDataType(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  HFSubConsumer::HFSubConsumer
            (in_RSI,(HighFreqDataType *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RCX,
             (consumer_queue_filter)CONCAT44(in_R8D,in_stack_ffffffffffffffd8));
  HighFreqDataType::~HighFreqDataType(in_stack_ffffffffffffff10);
  (in_RDI->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__SpikesConsumer_005d5ef0;
  HFParsingInfo::HFParsingInfo(this_00,in_RDI);
  *(undefined4 *)
   &in_RDI[0x10].indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = in_R8D;
  *(undefined4 *)
   &in_RDI[2].dataRequested.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = 3;
  sVar1 = spikePacket::headersize();
  in_RDI[0x10].sizeOf =
       sVar1 + 4 +
       (long)*(int *)&in_RDI[0x10].indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish * 4;
  piVar2 = (pointer)operator_new__(in_RDI[0x10].sizeOf);
  in_RDI[0x10].indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = piVar2;
  return;
}

Assistant:

SpikesConsumer::SpikesConsumer(HighFreqDataType hf, int ringbufsize, HFParsingInfo parseargs, int np)
    : HFSubConsumer(hf, ringbufsize),
      args(parseargs),
      maxpoints(np)
{
    sockType = ST_FILTERED_CONSUMER;
    //buffer to hold max possible size of spikes packet
    //ntrodeid + cluster + timestamp + waveformlength (in int2d's) + waveform memory
    tempbufsize = spikePacket::headersize() + sizeof(int) + sizeof(int2d)*maxpoints;
    tempbuffer = new byte[tempbufsize];
}